

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase793::run(TestCase793 *this)

{
  word *pwVar1;
  size_t sVar2;
  word wVar3;
  SegmentBuilder *pSVar4;
  WirePointer *pWVar5;
  SegmentBuilder *pSVar6;
  SegmentBuilder *pSVar7;
  WirePointer *pWVar8;
  int iVar9;
  word *pwVar10;
  word *pwVar11;
  bool bVar12;
  Reader value;
  Reader value_00;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar13;
  Builder root;
  MallocMessageBuilder builder;
  PointerBuilder local_1a0;
  OrphanBuilder local_188;
  StructBuilder local_160;
  OrphanBuilder local_138;
  MallocMessageBuilder local_118;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_118,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_1a0,&local_118.super_MessageBuilder);
  local_188.capTable = (CapTableBuilder *)local_1a0.pointer;
  local_188.tag.content = (uint64_t)local_1a0.segment;
  local_188.segment = (SegmentBuilder *)local_1a0.capTable;
  PointerBuilder::initStruct(&local_160,(PointerBuilder *)&local_188,(StructSize)0x140006);
  AVar13 = MessageBuilder::getSegmentsForOutput(&local_118.super_MessageBuilder);
  pwVar10 = (AVar13.ptr)->ptr;
  sVar2 = (AVar13.ptr)->size_;
  local_188.capTable = (CapTableBuilder *)(local_160.pointers + 1);
  local_188.tag.content = (uint64_t)local_160.segment;
  local_188.segment = (SegmentBuilder *)local_160.capTable;
  value.super_ArrayPtr<const_unsigned_char>.size_ = 7;
  value.super_ArrayPtr<const_unsigned_char>.ptr = (uchar *)"abcd123";
  PointerBuilder::setBlob<capnp::Data>((PointerBuilder *)&local_188,value);
  AVar13 = MessageBuilder::getSegmentsForOutput(&local_118.super_MessageBuilder);
  pwVar11 = (AVar13.ptr)->ptr + (AVar13.ptr)->size_;
  local_188.tag.content = (uint64_t)local_160.segment;
  local_188.segment = (SegmentBuilder *)local_160.capTable;
  local_188.capTable = (CapTableBuilder *)local_160.pointers;
  value_00.super_StringPtr.content.size_ = 4;
  value_00.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_188,value_00);
  AVar13 = MessageBuilder::getSegmentsForOutput(&local_118.super_MessageBuilder);
  if ((AVar13.size_ != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_1a0.segment = (SegmentBuilder *)CONCAT44(local_1a0.segment._4_4_,1);
    AVar13 = MessageBuilder::getSegmentsForOutput(&local_118.super_MessageBuilder);
    local_188.tag.content = AVar13.size_;
    kj::_::Debug::log<char_const(&)[65],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x323,ERROR,
               "\"failed: expected \" \"(1u) == (builder.getSegmentsForOutput().size())\", 1u, builder.getSegmentsForOutput().size()"
               ,(char (*) [65])"failed: expected (1u) == (builder.getSegmentsForOutput().size())",
               (uint *)&local_1a0,(unsigned_long *)&local_188);
  }
  local_1a0.pointer = local_160.pointers + 1;
  local_1a0.segment = local_160.segment;
  local_1a0.capTable = local_160.capTable;
  PointerBuilder::disown(&local_188,&local_1a0);
  local_138.segment = local_188.segment;
  local_138.capTable = local_188.capTable;
  local_138.location = local_188.location;
  local_138.tag.content = local_188.tag.content;
  if (local_188.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_138);
  }
  pwVar1 = pwVar10 + sVar2;
  bVar12 = pwVar11 <= pwVar1;
  if ((!bVar12) && ((char)pwVar1->content == '\0')) {
    pwVar10 = pwVar10 + sVar2;
    do {
      pwVar10 = (word *)((long)&pwVar10->content + 1);
      if (pwVar10 == pwVar11) break;
    } while ((char)pwVar10->content == '\0');
    bVar12 = pwVar11 <= pwVar10;
  }
  if ((!bVar12) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[47]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x327,ERROR,"\"failed: expected \" \"allZero(zerosStart, zerosEnd)\"",
               (char (*) [47])"failed: expected allZero(zerosStart, zerosEnd)");
  }
  local_188.tag.content = (uint64_t)local_160.segment;
  local_188.segment = (SegmentBuilder *)local_160.capTable;
  local_188.capTable = (CapTableBuilder *)local_160.pointers;
  PointerBuilder::getBlob<capnp::Text>
            ((Builder *)&local_1a0,(PointerBuilder *)&local_188,(void *)0x0,0);
  wVar3.content = local_188.tag.content;
  pSVar4 = local_188.segment;
  pWVar5 = (WirePointer *)local_188.capTable;
  pSVar6 = local_160.segment;
  pSVar7 = (SegmentBuilder *)local_160.capTable;
  pWVar8 = local_160.pointers;
  if (((local_1a0.pointer != (WirePointer *)0x4) ||
      (iVar9 = bcmp(local_1a0.capTable,"foo",3), wVar3.content = local_188.tag.content,
      pSVar4 = local_188.segment, pWVar5 = (WirePointer *)local_188.capTable,
      pSVar6 = local_160.segment, pSVar7 = (SegmentBuilder *)local_160.capTable,
      pWVar8 = local_160.pointers, iVar9 != 0)) &&
     (local_188.capTable = (CapTableBuilder *)pWVar8, local_188.segment = pSVar7,
     local_188.tag.content = (uint64_t)pSVar6, kj::_::Debug::minSeverity < 3)) {
    PointerBuilder::getBlob<capnp::Text>
              ((Builder *)&local_1a0,(PointerBuilder *)&local_188,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[50],char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x329,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (root.getTextField())\", \"foo\", root.getTextField()"
               ,(char (*) [50])"failed: expected (\"foo\") == (root.getTextField())",
               (char (*) [4])"foo",(Builder *)&local_1a0);
    wVar3.content = local_188.tag.content;
    pSVar4 = local_188.segment;
    pWVar5 = (WirePointer *)local_188.capTable;
  }
  local_188.capTable = (CapTableBuilder *)pWVar5;
  local_188.segment = pSVar4;
  local_188.tag.content = wVar3.content;
  MallocMessageBuilder::~MallocMessageBuilder(&local_118);
  return;
}

Assistant:

TEST(Orphans, DataZerodAfterUse) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  const word* zerosStart = builder.getSegmentsForOutput()[0].end();
  root.setDataField(data("abcd123"));
  const word* zerosEnd = builder.getSegmentsForOutput()[0].end();

  root.setTextField("foo");  // guard against overruns

  EXPECT_EQ(1u, builder.getSegmentsForOutput().size());  // otherwise test is invalid

  root.disownDataField();

  EXPECT_TRUE(allZero(zerosStart, zerosEnd));

  EXPECT_EQ("foo", root.getTextField());
}